

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead.cc
# Opt level: O2

vector<pstack::Procman::AddressRange,_std::allocator<pstack::Procman::AddressRange>_> * __thiscall
pstack::Procman::CoreProcess::addressSpace
          (vector<pstack::Procman::AddressRange,_std::allocator<pstack::Procman::AddressRange>_>
           *__return_storage_ptr__,CoreProcess *this)

{
  Off *this_00;
  size_t *__return_storage_ptr___00;
  long lVar1;
  ulong uVar2;
  uint uVar3;
  mapped_type *this_01;
  long *plVar4;
  iterator iVar5;
  long lVar6;
  long lVar7;
  undefined1 auVar8 [16];
  iterator pos;
  undefined1 local_190 [8];
  iterator __begin2;
  undefined1 local_110 [16];
  _Base_ptr local_100;
  _Base_ptr local_f8;
  _Base_ptr local_f0;
  size_t local_e8;
  undefined1 local_e0 [8];
  map<unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>_>_>_>
  entries;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>
  entry;
  set<pstack::Procman::AddressRange::Permission,_std::less<pstack::Procman::AddressRange::Permission>,_std::allocator<pstack::Procman::AddressRange::Permission>_>
  flags;
  
  entries._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&entries;
  entries._M_t._M_impl._0_4_ = 0;
  entries._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  entries._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  entries._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  entries._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       entries._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  FileEntries::FileEntries
            ((FileEntries *)&entry.second.fileOff,
             (this->coreImage).super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  pos.idx = 0;
  pos.arrayp = (ReaderArray<pstack::Procman::FileEntry,_42UL> *)
               flags._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  FileEntries::iterator::iterator((iterator *)local_190,(FileEntries *)&entry.second.fileOff,pos);
  __return_storage_ptr___00 = &entries._M_t._M_impl.super__Rb_tree_header._M_node_count;
  while (__begin2.entriesIterator.arrayp !=
         *(ReaderArray<pstack::Procman::FileEntry,_42UL> **)(__begin2.cur.second.fileOff + 0x20)) {
    FileEntries::iterator::operator*[abi_cxx11_
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>
                *)__return_storage_ptr___00,(iterator *)local_190);
    this_01 = std::
              map<unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>_>_>_>
              ::operator[]((map<unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>_>_>_>
                            *)local_e0,(key_type_conflict *)(entry.first.field_2._M_local_buf + 8));
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>
    ::operator=(this_01,(type)__return_storage_ptr___00);
    std::__cxx11::string::~string((string *)__return_storage_ptr___00);
    FileEntries::iterator::operator++((iterator *)local_190);
  }
  std::__cxx11::string::~string((string *)&__begin2.nameoff);
  FileEntries::~FileEntries((FileEntries *)&entry.second.fileOff);
  (__return_storage_ptr__->
  super__Vector_base<pstack::Procman::AddressRange,_std::allocator<pstack::Procman::AddressRange>_>)
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<pstack::Procman::AddressRange,_std::allocator<pstack::Procman::AddressRange>_>)
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<pstack::Procman::AddressRange,_std::allocator<pstack::Procman::AddressRange>_>)
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  plVar4 = (long *)pstack::Elf::Object::getSegments
                             ((uint)(this->coreImage).
                                    super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr);
  lVar1 = plVar4[1];
  this_00 = &entry.second.fileOff;
  for (lVar7 = *plVar4; lVar7 != lVar1; lVar7 = lVar7 + 0x38) {
    iVar5 = std::
            _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>_>_>_>
            ::upper_bound((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>_>_>_>
                           *)local_e0,(key_type_conflict *)(lVar7 + 0x10));
    entries._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)&entry.first._M_string_length
    ;
    entry.first._M_dataplus._M_p = (pointer)0x0;
    entry.first._M_string_length._0_1_ = 0;
    if (iVar5._M_node != entries._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      lVar6 = std::_Rb_tree_decrement(iVar5._M_node);
      uVar2 = *(key_type_conflict *)(lVar7 + 0x10);
      if ((uVar2 <= *(ulong *)(lVar6 + 0x20)) &&
         (*(ulong *)(lVar6 + 0x50) <= uVar2 + *(long *)(lVar7 + 0x28))) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &entries._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (lVar6 + 0x28));
      }
    }
    flags._M_t._M_impl._0_4_ = 0;
    flags._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    flags._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    flags._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&flags;
    flags._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    uVar3 = *(uint *)(lVar7 + 4);
    flags._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         flags._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if ((uVar3 & 2) != 0) {
      local_190._0_4_ = 1;
      std::
      _Rb_tree<pstack::Procman::AddressRange::Permission,_pstack::Procman::AddressRange::Permission,_std::_Identity<pstack::Procman::AddressRange::Permission>,_std::less<pstack::Procman::AddressRange::Permission>,_std::allocator<pstack::Procman::AddressRange::Permission>_>
      ::_M_insert_unique<pstack::Procman::AddressRange::Permission>
                ((_Rb_tree<pstack::Procman::AddressRange::Permission,_pstack::Procman::AddressRange::Permission,_std::_Identity<pstack::Procman::AddressRange::Permission>,_std::less<pstack::Procman::AddressRange::Permission>,_std::allocator<pstack::Procman::AddressRange::Permission>_>
                  *)this_00,(Permission *)local_190);
      uVar3 = *(uint *)(lVar7 + 4);
    }
    if ((uVar3 & 4) != 0) {
      local_190 = (undefined1  [8])((ulong)local_190 & 0xffffffff00000000);
      std::
      _Rb_tree<pstack::Procman::AddressRange::Permission,_pstack::Procman::AddressRange::Permission,_std::_Identity<pstack::Procman::AddressRange::Permission>,_std::less<pstack::Procman::AddressRange::Permission>,_std::allocator<pstack::Procman::AddressRange::Permission>_>
      ::_M_insert_unique<pstack::Procman::AddressRange::Permission>
                ((_Rb_tree<pstack::Procman::AddressRange::Permission,_pstack::Procman::AddressRange::Permission,_std::_Identity<pstack::Procman::AddressRange::Permission>,_std::less<pstack::Procman::AddressRange::Permission>,_std::allocator<pstack::Procman::AddressRange::Permission>_>
                  *)this_00,(Permission *)local_190);
      uVar3 = *(uint *)(lVar7 + 4);
    }
    if ((uVar3 & 1) != 0) {
      local_190._0_4_ = 2;
      std::
      _Rb_tree<pstack::Procman::AddressRange::Permission,_pstack::Procman::AddressRange::Permission,_std::_Identity<pstack::Procman::AddressRange::Permission>,_std::less<pstack::Procman::AddressRange::Permission>,_std::allocator<pstack::Procman::AddressRange::Permission>_>
      ::_M_insert_unique<pstack::Procman::AddressRange::Permission>
                ((_Rb_tree<pstack::Procman::AddressRange::Permission,_pstack::Procman::AddressRange::Permission,_std::_Identity<pstack::Procman::AddressRange::Permission>,_std::less<pstack::Procman::AddressRange::Permission>,_std::allocator<pstack::Procman::AddressRange::Permission>_>
                  *)this_00,(Permission *)local_190);
    }
    local_190 = *(undefined1 (*) [8])(lVar7 + 0x10);
    auVar8._8_4_ = SUB84(local_190,0);
    auVar8._0_8_ = local_190;
    auVar8._12_4_ = (int)((ulong)local_190 >> 0x20);
    lVar6 = (long)&(((FileEntries *)local_190)->header).count + *(long *)(lVar7 + 0x20);
    __begin2._8_4_ = (int)lVar6;
    __begin2.entries = auVar8._8_8_ + *(long *)(lVar7 + 0x28);
    __begin2._12_4_ = (int)((ulong)lVar6 >> 0x20);
    __begin2.nameoff = 0;
    __begin2.cur.first._M_dataplus._M_p = (pointer)0x0;
    __begin2.cur.first._M_string_length = 0;
    std::__cxx11::string::string
              ((string *)__begin2.cur.first.field_2._M_local_buf,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &entries._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    _Rb_tree<pstack::Procman::AddressRange::Permission,_pstack::Procman::AddressRange::Permission,_std::_Identity<pstack::Procman::AddressRange::Permission>,_std::less<pstack::Procman::AddressRange::Permission>,_std::allocator<pstack::Procman::AddressRange::Permission>_>
    ::_Rb_tree((_Rb_tree<pstack::Procman::AddressRange::Permission,_pstack::Procman::AddressRange::Permission,_std::_Identity<pstack::Procman::AddressRange::Permission>,_std::less<pstack::Procman::AddressRange::Permission>,_std::allocator<pstack::Procman::AddressRange::Permission>_>
                *)&__begin2.cur.second.fileOff,
               (_Rb_tree<pstack::Procman::AddressRange::Permission,_pstack::Procman::AddressRange::Permission,_std::_Identity<pstack::Procman::AddressRange::Permission>,_std::less<pstack::Procman::AddressRange::Permission>,_std::allocator<pstack::Procman::AddressRange::Permission>_>
                *)this_00);
    local_110 = (undefined1  [16])0x0;
    local_100 = (_Base_ptr)0x0;
    local_f8 = (_Base_ptr)(local_110 + 8);
    local_e8 = 0;
    local_f0 = local_f8;
    std::vector<pstack::Procman::AddressRange,_std::allocator<pstack::Procman::AddressRange>_>::
    emplace_back<pstack::Procman::AddressRange>(__return_storage_ptr__,(AddressRange *)local_190);
    AddressRange::~AddressRange((AddressRange *)local_190);
    std::
    _Rb_tree<pstack::Procman::AddressRange::Permission,_pstack::Procman::AddressRange::Permission,_std::_Identity<pstack::Procman::AddressRange::Permission>,_std::less<pstack::Procman::AddressRange::Permission>,_std::allocator<pstack::Procman::AddressRange::Permission>_>
    ::~_Rb_tree((_Rb_tree<pstack::Procman::AddressRange::Permission,_pstack::Procman::AddressRange::Permission,_std::_Identity<pstack::Procman::AddressRange::Permission>,_std::less<pstack::Procman::AddressRange::Permission>,_std::allocator<pstack::Procman::AddressRange::Permission>_>
                 *)this_00);
    std::__cxx11::string::~string
              ((string *)&entries._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>_>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>_>_>_>
               *)local_e0);
  return __return_storage_ptr__;
}

Assistant:

std::vector<AddressRange>
CoreProcess::addressSpace() const {
    // First, go through the NT_FILE note if we have one - that gives us filenames
    std::map<Elf::Off, std::pair<std::string, FileEntry>> entries;
    for (auto entry : FileEntries(*coreImage))
        entries[entry.second.start] = entry;

    // Now go through the PT_LOAD segments in the core to generate the result.
    std::vector<AddressRange> rv;
    for (const auto &hdr : coreImage->getSegments(PT_LOAD)) {
        auto ub = entries.upper_bound(hdr.p_vaddr);
        std::string name;
        if (ub != entries.begin()) {
            --ub;
            if (ub->first >= hdr.p_vaddr && ub->second.second.end <= hdr.p_vaddr + hdr.p_memsz)
                name = ub->second.first;
        }
        std::set<AddressRange::Permission> flags;
        if ((hdr.p_flags & PF_W) != 0)
           flags.insert(AddressRange::Permission::write);
        if ((hdr.p_flags & PF_R) != 0)
           flags.insert(AddressRange::Permission::read);
        if ((hdr.p_flags & PF_X) != 0)
           flags.insert(AddressRange::Permission::exec);
        rv.push_back( { hdr.p_vaddr, hdr.p_vaddr + hdr.p_memsz,
                hdr.p_vaddr + hdr.p_filesz, 0, {0, 0, 0, name}, flags, {}});
    }
    return rv;
}